

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

void __thiscall lambda::parse_from::helper::get_dot(helper *this)

{
  int iVar1;
  int iVar2;
  int_type ch;
  helper *this_local;
  
  eat_whitespace(this);
  iVar1 = std::istream::get();
  if ((iVar1 == 0x28) && (iVar2 = std::istream::peek(), iVar2 == 0x2a)) {
    std::istream::get();
    comment(this);
    get_dot(this);
    return;
  }
  if (iVar1 == 0x2e) {
    std::istream::get();
    return;
  }
  unexpected_thing(this);
}

Assistant:

void get_dot() {
      eat_whitespace();
	  auto ch = inp.get();
      if (ch == '(' and inp.peek() == '*') {
        inp.get();
        comment();
        return get_dot();
      }

      if (ch == '.') {
        inp.get();
      } else {
        unexpected_thing();
      }
    }